

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>::
insert(Span<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_> *this,
      size_t i)

{
  byte bVar1;
  
  if (this->nextFree == this->allocated) {
    addStorage(this);
  }
  bVar1 = this->nextFree;
  this->nextFree = this->entries[bVar1].storage.data[0];
  this->offsets[i] = bVar1;
  return (Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)(this->entries + bVar1);
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }